

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDimple::DeleteComponents
          (ON_SubDimple *this,uint level_index,bool bDeleteIsolatedEdges,
          bool bUpdateTagsAndCoefficients,bool bMarkDeletedFaceEdges)

{
  ON_SubDHeap *pOVar1;
  unsigned_short uVar2;
  undefined2 uVar24;
  undefined2 uVar25;
  ON_SubDFace *pOVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDimple *this_00;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  ushort uVar9;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ON_SubDFacePtr *pOVar10;
  ON_SubDEdge *pOVar11;
  unsigned_short fei;
  unsigned_short uVar12;
  ushort uVar13;
  ON_SubDFacePtr *pOVar14;
  undefined7 in_register_00000081;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  ON_SubDEdgePtr *pOVar18;
  ON_SubDLevel *pOVar19;
  ON_SubDVertex *pOVar20;
  ON_SubDFace *pOVar21;
  char cVar22;
  ulong uVar23;
  ON_ComponentStatus allsetcheck;
  ON_ComponentStatus local_6a;
  uint local_68;
  undefined4 local_64;
  ON_SubDLevel *local_60;
  undefined4 local_54;
  ON_SubDimple *local_50;
  double local_48;
  uint local_3c;
  ON_SubDHeap *local_38;
  
  local_48 = (double)CONCAT44(local_48._4_4_,
                              (int)CONCAT71(in_register_00000081,bMarkDeletedFaceEdges));
  local_64 = (undefined4)CONCAT71(in_register_00000011,bDeleteIsolatedEdges);
  if ((level_index < (uint)(this->m_levels).m_count) &&
     (local_60 = (this->m_levels).m_a[level_index], local_60 != (ON_SubDLevel *)0x0)) {
    local_3c = level_index;
    if (bMarkDeletedFaceEdges) {
      for (pOVar11 = local_60->m_edge[0]; pOVar11 != (ON_SubDEdge *)0x0;
          pOVar11 = pOVar11->m_next_edge) {
        ON_ComponentStatus::ClearRuntimeMark(&(pOVar11->super_ON_SubDComponentBase).m_status);
      }
    }
    local_54 = (undefined4)CONCAT71(in_register_00000009,bUpdateTagsAndCoefficients);
    local_50 = this;
    if (local_60->m_face[0] == (ON_SubDFace *)0x0) {
      local_68 = 0;
      pOVar19 = local_60;
    }
    else {
      local_38 = &this->m_heap;
      local_68 = 0;
      pOVar21 = local_60->m_face[0];
      do {
        pOVar3 = pOVar21->m_next_face;
        bVar6 = ON_ComponentStatus::operator==
                          (&ON_ComponentStatus::AllSet,
                           &(pOVar21->super_ON_SubDComponentBase).m_status);
        if ((bVar6) || (pOVar21->m_edge_count == 0)) {
LAB_005e2181:
          if ((local_48._0_1_ != '\0') && (uVar7 = pOVar21->m_edge_count, uVar7 != 0)) {
            pOVar18 = pOVar21->m_edge4;
            uVar9 = 0;
            do {
              if ((uVar9 == 4) && (pOVar18 = pOVar21->m_edgex, pOVar18 == (ON_SubDEdgePtr *)0x0))
              break;
              uVar23 = pOVar18->m_ptr & 0xfffffffffffffff8;
              if (uVar23 != 0) {
                ON_ComponentStatus::SetRuntimeMark((ON_ComponentStatus *)(uVar23 + 0x10));
                uVar7 = pOVar21->m_edge_count;
              }
              uVar9 = uVar9 + 1;
              pOVar18 = pOVar18 + 1;
            } while (uVar9 < uVar7);
          }
          pOVar19 = local_60;
          ON_SubDLevel::RemoveFace(local_60,pOVar21);
          ON_SubDHeap::ReturnFace(local_38,pOVar21);
          local_68 = local_68 + 1;
        }
        else {
          pOVar18 = pOVar21->m_edge4;
          uVar7 = 0;
          do {
            if ((uVar7 == 4) &&
               (pOVar18 = pOVar21->m_edgex, pOVar19 = local_60, pOVar18 == (ON_SubDEdgePtr *)0x0))
            break;
            uVar23 = pOVar18->m_ptr & 0xfffffffffffffff8;
            if (uVar23 == 0) goto LAB_005e2181;
            if ((((*(long *)(uVar23 + 0x80) == 0) || (*(long *)(uVar23 + 0x88) == 0)) ||
                (bVar6 = ON_ComponentStatus::operator==
                                   (&ON_ComponentStatus::AllSet,
                                    (ON_ComponentStatus *)(uVar23 + 0x10)), bVar6)) ||
               ((bVar6 = ON_ComponentStatus::operator==
                                   (&ON_ComponentStatus::AllSet,
                                    (ON_ComponentStatus *)(*(long *)(uVar23 + 0x80) + 0x10)), bVar6
                || (bVar6 = ON_ComponentStatus::operator==
                                      (&ON_ComponentStatus::AllSet,
                                       (ON_ComponentStatus *)(*(long *)(uVar23 + 0x88) + 0x10)),
                   bVar6)))) {
              bVar6 = ON_ComponentStatus::operator!=
                                (&ON_ComponentStatus::AllSet,(ON_ComponentStatus *)(uVar23 + 0x10));
              if (bVar6) {
                *(ON_ComponentStatus *)(uVar23 + 0x10) = ON_ComponentStatus::AllSet;
              }
              goto LAB_005e2181;
            }
            uVar7 = uVar7 + 1;
            pOVar18 = pOVar18 + 1;
            pOVar19 = local_60;
          } while (uVar7 < pOVar21->m_edge_count);
        }
        pOVar21 = pOVar3;
      } while (pOVar3 != (ON_SubDFace *)0x0);
    }
    local_6a.m_status_flags = '\0';
    local_6a.m_mark_bits = '\0';
    if (pOVar19->m_edge[0] != (ON_SubDEdge *)0x0) {
      cVar22 = (char)local_64;
      pOVar1 = &local_50->m_heap;
      pOVar11 = pOVar19->m_edge[0];
      do {
        pOVar4 = pOVar11->m_next_edge;
        uVar24._0_1_ = (pOVar11->super_ON_SubDComponentBase).m_status.m_status_flags;
        uVar24._1_1_ = (pOVar11->super_ON_SubDComponentBase).m_status.m_mark_bits;
        local_6a = ON_ComponentStatus::LogicalAnd
                             (ON_ComponentStatus::AllSet,(ON_ComponentStatus)uVar24);
        bVar6 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_6a);
        if (bVar6 || cVar22 != '\x01') {
          if (bVar6) goto LAB_005e22c0;
LAB_005e2272:
          bVar6 = true;
          do {
            bVar17 = bVar6;
            if ((((pOVar11->m_vertex[0] == (ON_SubDVertex *)0x0) ||
                 (pOVar11->m_vertex[1] == (ON_SubDVertex *)0x0)) ||
                (bVar6 = ON_ComponentStatus::operator==
                                   (&ON_ComponentStatus::AllSet,
                                    &(pOVar11->m_vertex[0]->super_ON_SubDComponentBase).m_status),
                bVar6)) ||
               (bVar6 = ON_ComponentStatus::operator==
                                  (&ON_ComponentStatus::AllSet,
                                   &(pOVar11->m_vertex[1]->super_ON_SubDComponentBase).m_status),
               bVar6)) goto LAB_005e22c0;
            bVar6 = false;
          } while (bVar17);
        }
        else {
          if (pOVar11->m_face_count != 0) goto LAB_005e2272;
LAB_005e22c0:
          ON_SubDLevel::RemoveEdge(local_60,pOVar11);
          ON_SubDHeap::ReturnEdge(pOVar1,pOVar11);
          local_68 = local_68 + 1;
        }
        pOVar11 = pOVar4;
      } while (pOVar4 != (ON_SubDEdge *)0x0);
    }
    pOVar19 = local_60;
    if (local_60->m_vertex[0] != (ON_SubDVertex *)0x0) {
      pOVar1 = &local_50->m_heap;
      pOVar20 = local_60->m_vertex[0];
      do {
        pOVar5 = pOVar20->m_next_vertex;
        uVar25._0_1_ = (pOVar20->super_ON_SubDComponentBase).m_status.m_status_flags;
        uVar25._1_1_ = (pOVar20->super_ON_SubDComponentBase).m_status.m_mark_bits;
        local_6a = ON_ComponentStatus::LogicalAnd
                             (ON_ComponentStatus::AllSet,(ON_ComponentStatus)uVar25);
        bVar6 = ON_ComponentStatus::operator==(&ON_ComponentStatus::AllSet,&local_6a);
        if (((bVar6) || (((byte)local_64 != '\0' && (pOVar20->m_face_count == 0)))) ||
           (pOVar20->m_edge_count == 0)) {
          ON_SubDLevel::RemoveVertex(pOVar19,pOVar20);
          ON_SubDHeap::ReturnVertex(pOVar1,pOVar20);
          local_68 = local_68 + 1;
        }
        pOVar20 = pOVar5;
      } while (pOVar5 != (ON_SubDVertex *)0x0);
    }
    this_00 = local_50;
    if (local_68 != 0) {
      cVar22 = (char)local_54;
      if (pOVar19->m_edge[0] != (ON_SubDEdge *)0x0) {
        pOVar1 = &local_50->m_heap;
        local_48 = -8883.0;
        pOVar11 = pOVar19->m_edge[0];
        do {
          pOVar4 = pOVar11->m_next_edge;
          uVar2 = pOVar11->m_face_count;
          pOVar11->m_face_count = 0;
          if (uVar2 == 0) {
            if ((byte)local_64 != 0) goto LAB_005e2438;
LAB_005e2454:
            if (pOVar11->m_facex != (ON_SubDFacePtr *)0x0) {
              ON_SubDHeap::ReturnEdgeExtraArray(pOVar1,pOVar11);
            }
LAB_005e2466:
            if (cVar22 != '\0') {
              if (pOVar11->m_face_count != 2) {
                pOVar11->m_edge_tag = Crease;
              }
              pOVar11->m_sector_coefficient[0] = local_48;
              pOVar11->m_sector_coefficient[1] = local_48;
            }
          }
          else {
            pOVar10 = pOVar11->m_face2;
            uVar7 = 0;
            uVar9 = 0;
            uVar12 = 0;
            pOVar14 = pOVar10;
            do {
              if (uVar12 == 2) {
                pOVar14 = pOVar11->m_facex;
              }
              uVar23 = pOVar14->m_ptr & 0xfffffffffffffff8;
              if ((uVar23 != 0) && (*(int *)(uVar23 + 0xc) != -1)) {
                pOVar10->m_ptr = pOVar14->m_ptr;
                uVar9 = uVar9 + 1;
                pOVar11->m_face_count = uVar9;
                if (uVar9 == 2) {
                  pOVar10 = pOVar11->m_facex;
                  uVar7 = 2;
                  uVar9 = 2;
                }
                else {
                  pOVar10 = pOVar10 + 1;
                  uVar7 = uVar9;
                }
              }
              uVar12 = uVar12 + 1;
              pOVar14 = pOVar14 + 1;
            } while (uVar2 != uVar12);
            if (((byte)local_64 & uVar7 == 0) == 0) {
              if (uVar7 < 3) goto LAB_005e2454;
              goto LAB_005e2466;
            }
LAB_005e2438:
            ON_SubDLevel::RemoveEdge(pOVar19,pOVar11);
            ON_SubDHeap::ReturnEdge(pOVar1,pOVar11);
            local_68 = local_68 + 1;
          }
          pOVar11 = pOVar4;
        } while (pOVar4 != (ON_SubDEdge *)0x0);
      }
      if (pOVar19->m_vertex[0] != (ON_SubDVertex *)0x0) {
        pOVar20 = pOVar19->m_vertex[0];
        do {
          pOVar5 = pOVar20->m_next_vertex;
          uVar7 = pOVar20->m_edge_count;
          pOVar20->m_edge_count = 0;
          if ((ulong)uVar7 == 0) {
            uVar9 = 0;
            bVar6 = false;
            uVar8 = 0;
          }
          else {
            pOVar18 = pOVar20->m_edges;
            bVar6 = true;
            uVar9 = 0;
            uVar23 = 0;
            uVar8 = 0;
            do {
              uVar16 = pOVar18[uVar23].m_ptr;
              uVar15 = uVar16 & 0xfffffffffffffff8;
              if ((uVar15 == 0) || (*(int *)(uVar15 + 0xc) == -1)) {
                bVar6 = false;
              }
              else {
                uVar8 = uVar8 + (*(char *)(uVar15 + 0x60) == '\x02');
                if (*(short *)(uVar15 + 100) != 2) {
                  bVar6 = false;
                }
                uVar15 = (ulong)uVar9;
                uVar9 = uVar9 + 1;
                pOVar20->m_edge_count = uVar9;
                pOVar18[uVar15].m_ptr = uVar16;
              }
              uVar23 = uVar23 + 1;
            } while (uVar7 != uVar23);
            bVar6 = !bVar6;
          }
          uVar7 = pOVar20->m_face_count;
          pOVar20->m_face_count = 0;
          if ((ulong)uVar7 == 0) {
LAB_005e257f:
            if (uVar9 != 0) {
              bVar17 = false;
              goto LAB_005e2586;
            }
            ON_SubDLevel::RemoveVertex(local_60,pOVar20);
            ON_SubDHeap::ReturnVertex(&this_00->m_heap,pOVar20);
            local_68 = local_68 + 1;
          }
          else {
            uVar13 = 0;
            uVar23 = 0;
            do {
              pOVar21 = pOVar20->m_faces[uVar23];
              if ((pOVar21 != (ON_SubDFace *)0x0) &&
                 ((pOVar21->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
                uVar16 = (ulong)uVar13;
                uVar13 = uVar13 + 1;
                pOVar20->m_face_count = uVar13;
                pOVar20->m_faces[uVar16] = pOVar21;
              }
              uVar23 = uVar23 + 1;
            } while (uVar7 != uVar23);
            bVar17 = true;
            if (uVar13 == 0) goto LAB_005e257f;
LAB_005e2586:
            if (uVar8 == 1) {
              if (bVar17 || uVar9 != 1) {
LAB_005e25a2:
                if (((bool)(bVar6 | uVar8 == 2)) && ((pOVar20->m_vertex_tag & ~Smooth) != Crease)) {
                  pOVar20->m_vertex_tag = Crease;
                }
                goto LAB_005e25da;
              }
            }
            else if (uVar8 < 3) goto LAB_005e25a2;
            pOVar20->m_vertex_tag = Corner;
          }
LAB_005e25da:
          pOVar20 = pOVar5;
        } while (pOVar5 != (ON_SubDVertex *)0x0);
      }
      pOVar19 = local_60;
      if (((local_60->m_vertex_count == 0) || (local_60->m_edge_count == 0)) ||
         (((byte)local_64 != '\0' && (local_60->m_face_count == 0)))) {
        Destroy(this_00);
      }
      else {
        ON_AggregateComponentStatusEx::MarkAsNotCurrent
                  (&(local_60->m_aggregates).m_aggregate_status);
        ON_SubDLevel::ClearEvaluationCache(pOVar19);
        ClearHigherSubdivisionLevels(this_00,local_3c);
        if (cVar22 != '\0') {
          ON_SubDLevel::UpdateAllTagsAndSectorCoefficients(pOVar19,false);
        }
      }
      ChangeGeometryContentSerialNumber(this_00,false);
      return local_68;
    }
  }
  else {
    ON_SubDIncrementErrorCount();
  }
  return 0;
}

Assistant:

unsigned int ON_SubDimple::DeleteComponents(
  unsigned int level_index,
  bool bDeleteIsolatedEdges,
  bool bUpdateTagsAndCoefficients,
  bool bMarkDeletedFaceEdges
  )
{ 
  unsigned int deleted_component_count = 0;

  if (level_index >= m_levels.UnsignedCount())
    return ON_SUBD_RETURN_ERROR(0);

  ON_SubDLevel* level = m_levels[level_index];
  if (nullptr == level)
    return ON_SUBD_RETURN_ERROR(0);

  if (bMarkDeletedFaceEdges)
    level->ClearRuntimeMarks(false,true,false);

  ON_SubDFace* next_face = level->m_face[0];
  for (ON_SubDFace* face = next_face; nullptr != face; face = next_face)
  {
    next_face = const_cast< ON_SubDFace* >(face->m_next_face);
    bool bDelete = (ON_ComponentStatus::AllSet == face->m_status || 0 == face->m_edge_count);
    if (false == bDelete)
    {
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count && false == bDelete; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr == edge
          || nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
        {
          bDelete = true;
          if (nullptr != edge && ON_ComponentStatus::AllSet != edge->m_status)
            edge->m_status = ON_ComponentStatus::AllSet;
        }
      }
      if (false == bDelete)
        continue;
    }

    if (bMarkDeletedFaceEdges)
    {
      // Set runtime mark on face's boundary edges.
      const ON_SubDEdgePtr* eptr = face->m_edge4;
      for (unsigned short fei = 0; fei < face->m_edge_count ; ++fei, ++eptr)
      {
        if (4 == fei)
        {
          eptr = face->m_edgex;
          if (nullptr == eptr)
            break;
        }
        const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
        if (nullptr != edge)
          edge->m_status.SetRuntimeMark();
      }
    }

    level->RemoveFace(face);
    m_heap.ReturnFace(face);
    deleted_component_count++;
  }

  ON_ComponentStatus allsetcheck;
  ON_SubDEdge* next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast< ON_SubDEdge* >(edge->m_next_edge);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, edge->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == edge->m_face_count) );
    if (false == bDelete)
    {
      for (unsigned short evi = 0; evi < 2 && false == bDelete; evi++)
      {
        if (nullptr == edge->m_vertex[0]
          || nullptr == edge->m_vertex[1]
          || ON_ComponentStatus::AllSet == edge->m_vertex[0]->m_status
          || ON_ComponentStatus::AllSet == edge->m_vertex[1]->m_status
          )
          bDelete = true;
      }
      if (false == bDelete)
        continue;
    }

    level->RemoveEdge(edge);
    m_heap.ReturnEdge(edge);
    deleted_component_count++;
  }

  ON_SubDVertex* next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);
    allsetcheck = ON_ComponentStatus::LogicalAnd(ON_ComponentStatus::AllSet, vertex->m_status);
    bool bDelete = (ON_ComponentStatus::AllSet == allsetcheck || (bDeleteIsolatedEdges && 0 == vertex->m_face_count) || 0 == vertex->m_edge_count );
    if ( false == bDelete )
      continue;

    level->RemoveVertex(vertex);
    m_heap.ReturnVertex(vertex);
    deleted_component_count++;
  }

  if ( 0 == deleted_component_count )
    return 0;

  // Remove edge references to deleted faces
  next_edge = level->m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);
    ON_SubDFacePtr* fptr0 = edge->m_face2;
    ON_SubDFacePtr* fptr1 = edge->m_face2;
    const unsigned short edge_face_count = edge->m_face_count;
    edge->m_face_count = 0;
    for (unsigned short efi = 0; efi < edge_face_count; efi++, fptr0++)
    {
      if (2 == efi)
        fptr0 = edge->m_facex;
      const ON_SubDFace* face = fptr0->Face();
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId())
        continue;
      *fptr1++ = *fptr0;
      edge->m_face_count++;
      if (2 == edge->m_face_count)
        fptr1 = edge->m_facex;
    }

    if (0 == edge->m_face_count && bDeleteIsolatedEdges)
    {
      level->RemoveEdge(edge);
      m_heap.ReturnEdge(edge);
      deleted_component_count++;
      continue;
    }
    
    if (edge->m_face_count <= 2 && nullptr != edge->m_facex)
      m_heap.ReturnEdgeExtraArray(edge);

    if (bUpdateTagsAndCoefficients)
    {
      if (edge->m_face_count != 2)
        edge->m_edge_tag = ON_SubDEdgeTag::Crease;

      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
    }
  }

  // Remove vertex references to deleted edges and faces
  next_vertex = level->m_vertex[0];
  for (ON_SubDVertex* vertex = next_vertex; nullptr != vertex; vertex = next_vertex)
  {
    next_vertex = const_cast<ON_SubDVertex*>(vertex->m_next_vertex);

    unsigned int count = vertex->m_edge_count;
    vertex->m_edge_count = 0;

    bool bInteriorVertex = true;
    unsigned int crease_count = 0;
    for (unsigned short vei = 0; vei < count; vei++)
    {
      const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(vertex->m_edges[vei].m_ptr);
      if (nullptr == edge || ON_UNSET_UINT_INDEX == edge->ArchiveId())
      {
        bInteriorVertex = false;
        continue;
      }
      if (edge->IsCrease())
        crease_count++;
      if (2 != edge->m_face_count)
        bInteriorVertex = false;
      vertex->m_edges[vertex->m_edge_count++] = vertex->m_edges[vei];
    }


    count = vertex->m_face_count;
    vertex->m_face_count = 0;
    for (unsigned short vfi = 0; vfi < count; vfi++)
    {
      const ON_SubDFace* face = vertex->m_faces[vfi];
      if (nullptr == face || ON_UNSET_UINT_INDEX == face->ArchiveId()) 
        continue;
      vertex->m_faces[vertex->m_face_count++] = vertex->m_faces[vfi];
    }

    if (0 == vertex->m_face_count && 0 == vertex->m_edge_count)
    {
      level->RemoveVertex(vertex);
      m_heap.ReturnVertex(vertex);
      deleted_component_count++;
    }
    else
    {
      if (1 == crease_count && 1 == vertex->m_edge_count && 0 == vertex->m_face_count)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (crease_count > 2)
        vertex->m_vertex_tag = ON_SubDVertexTag::Corner;
      else if (false == bInteriorVertex || crease_count > 1)
      {
        if (false == vertex->IsCreaseOrCorner())
          vertex->m_vertex_tag = ON_SubDVertexTag::Crease;
      }
    }
  }

  if (0 == level->m_vertex_count || 0 == level->m_edge_count || (bDeleteIsolatedEdges && 0 == level->m_face_count))
  {
    Destroy();
  }
  else
  {
    // remove all information that is no longer valid
    level->MarkAggregateComponentStatusAsNotCurrent();
    level->ClearEvaluationCache();

    ClearHigherSubdivisionLevels(level_index);

    if (bUpdateTagsAndCoefficients)
    {
      // Update vertex tags, edge tags, and sector coefficients.
      level->UpdateAllTagsAndSectorCoefficients(false);
    }
  }

  ChangeGeometryContentSerialNumber(false);

  return deleted_component_count;
}